

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

csptr __thiscall pstack::Elf::NoteDesc::data(NoteDesc *this)

{
  element_type *peVar1;
  size_t sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint *in_RSI;
  csptr cVar3;
  allocator<char> local_39;
  string local_38 [40];
  NoteDesc *this_local;
  
  this_local = this;
  peVar1 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"note descriptor",&local_39);
  sVar2 = roundup2((ulong)*in_RSI,4);
  (*peVar1->_vptr_Reader[9])(this,peVar1,local_38,sVar2 + 0xc,(ulong)in_RSI[1]);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  cVar3.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar3.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (csptr)cVar3.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr
NoteDesc::data() const
{
   return io->view("note descriptor", sizeof note + roundup2(note.n_namesz, 4), note.n_descsz);
}